

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_no_mac.c
# Opt level: O1

int32_t ll_header_enabled_set(uint8_t enabled)

{
  int32_t iVar1;
  undefined7 in_register_00000039;
  uint8_t buf [9];
  uint8_t local_10 [16];
  
  local_10[8] = 0;
  local_10[0] = ' ';
  local_10[1] = '\0';
  local_10[2] = '\0';
  local_10[3] = '\0';
  local_10[4] = '\0';
  local_10[5] = '\0';
  local_10[6] = '\0';
  local_10[7] = '\0';
  if ((int)CONCAT71(in_register_00000039,enabled) != 0) {
    local_10[0] = ' ';
    local_10[1] = '\0';
    local_10[2] = '\x01';
    local_10[3] = '\0';
    local_10[4] = '\0';
    local_10[5] = '\0';
    local_10[6] = '\0';
    local_10[7] = '\0';
  }
  iVar1 = hal_read_write(OP_SET_RADIO_PARAMS,local_10,9,(uint8_t *)0x0,0);
  return iVar1;
}

Assistant:

int32_t ll_header_enabled_set(uint8_t enabled)
{
    return ll_radio_params_set(RADIO_PARAM_FLAGS_HEADER, 0, 0, 0, 0, 0, enabled, 0, 0);
}